

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O0

bool QTransform::squareToQuad(QPolygonF *quad,QTransform *trans)

{
  bool bVar1;
  qsizetype qVar2;
  const_reference pQVar3;
  int iVar4;
  QTransform *in_RSI;
  QList<QPointF> *in_RDI;
  qreal m31;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  qreal m32;
  qreal qVar8;
  qreal qVar9;
  qreal qVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double m13;
  double h;
  double g;
  double f;
  double e;
  double d;
  double c;
  double b;
  double a;
  double bottom;
  double htop;
  double gtop;
  double ay2;
  double ay1;
  double ax2;
  double ax1;
  double ay;
  double ax;
  qreal dy3;
  qreal dy2;
  qreal dy1;
  qreal dy0;
  qreal dx3;
  qreal dx2;
  qreal dx1;
  qreal dx0;
  qsizetype in_stack_ffffffffffffff08;
  QList<QPointF> *in_stack_ffffffffffffff10;
  QPolygonF *in_stack_ffffffffffffff20;
  bool local_1;
  
  qVar2 = QList<QPointF>::size(in_RDI);
  bVar1 = QPolygonF::isClosed(in_stack_ffffffffffffff20);
  iVar4 = 4;
  if (bVar1) {
    iVar4 = 5;
  }
  if (qVar2 == iVar4) {
    pQVar3 = QList<QPointF>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    m31 = QPointF::x(pQVar3);
    pQVar3 = QList<QPointF>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    qVar5 = QPointF::x(pQVar3);
    pQVar3 = QList<QPointF>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    qVar6 = QPointF::x(pQVar3);
    pQVar3 = QList<QPointF>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    qVar7 = QPointF::x(pQVar3);
    pQVar3 = QList<QPointF>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    m32 = QPointF::y(pQVar3);
    pQVar3 = QList<QPointF>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    qVar8 = QPointF::y(pQVar3);
    pQVar3 = QList<QPointF>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    qVar9 = QPointF::y(pQVar3);
    pQVar3 = QList<QPointF>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    qVar10 = QPointF::y(pQVar3);
    dVar11 = ((m31 - qVar5) + qVar6) - qVar7;
    dVar12 = ((m32 - qVar8) + qVar9) - qVar10;
    if ((((dVar11 != 0.0) || (NAN(dVar11))) || (dVar12 != 0.0)) || (NAN(dVar12))) {
      dVar13 = (qVar5 - qVar6) * (qVar10 - qVar9) + -((qVar7 - qVar6) * (qVar8 - qVar9));
      if ((dVar13 == 0.0) && (!NAN(dVar13))) {
        return false;
      }
      m13 = (dVar11 * (qVar10 - qVar9) + -((qVar7 - qVar6) * dVar12)) / dVar13;
      dVar13 = ((qVar5 - qVar6) * dVar12 + -(dVar11 * (qVar8 - qVar9))) / dVar13;
      setMatrix(in_RSI,m13 * qVar5 + (qVar5 - m31),m13 * qVar8 + (qVar8 - m32),m13,
                dVar13 * qVar7 + (qVar7 - m31),dVar13 * qVar10 + (qVar10 - m32),dVar13,m31,m32,1.0);
    }
    else {
      setMatrix(in_RSI,qVar5 - m31,qVar8 - m32,0.0,qVar6 - qVar5,qVar9 - qVar8,0.0,m31,m32,1.0);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QTransform::squareToQuad(const QPolygonF &quad, QTransform &trans)
{
    if (quad.size() != (quad.isClosed() ? 5 : 4))
        return false;

    qreal dx0 = quad[0].x();
    qreal dx1 = quad[1].x();
    qreal dx2 = quad[2].x();
    qreal dx3 = quad[3].x();

    qreal dy0 = quad[0].y();
    qreal dy1 = quad[1].y();
    qreal dy2 = quad[2].y();
    qreal dy3 = quad[3].y();

    double ax  = dx0 - dx1 + dx2 - dx3;
    double ay  = dy0 - dy1 + dy2 - dy3;

    if (!ax && !ay) { //afine transform
        trans.setMatrix(dx1 - dx0, dy1 - dy0,  0,
                        dx2 - dx1, dy2 - dy1,  0,
                        dx0,       dy0,  1);
    } else {
        double ax1 = dx1 - dx2;
        double ax2 = dx3 - dx2;
        double ay1 = dy1 - dy2;
        double ay2 = dy3 - dy2;

        /*determinants */
        double gtop    =  ax  * ay2 - ax2 * ay;
        double htop    =  ax1 * ay  - ax  * ay1;
        double bottom  =  ax1 * ay2 - ax2 * ay1;

        double a, b, c, d, e, f, g, h;  /*i is always 1*/

        if (!bottom)
            return false;

        g = gtop/bottom;
        h = htop/bottom;

        a = dx1 - dx0 + g * dx1;
        b = dx3 - dx0 + h * dx3;
        c = dx0;
        d = dy1 - dy0 + g * dy1;
        e = dy3 - dy0 + h * dy3;
        f = dy0;

        trans.setMatrix(a, d, g,
                        b, e, h,
                        c, f, 1.0);
    }

    return true;
}